

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

xmlChar * xmlBufDetach(xmlBufPtr buf)

{
  xmlChar *ret;
  xmlBufPtr buf_local;
  
  if (buf == (xmlBufPtr)0x0) {
    buf_local = (xmlBufPtr)0x0;
  }
  else if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) {
    buf_local = (xmlBufPtr)0x0;
  }
  else if (buf->buffer == (xmlBufferPtr)0x0) {
    if (buf->error == 0) {
      buf_local = (xmlBufPtr)buf->content;
      buf->content = (xmlChar *)0x0;
      buf->size = 0;
      buf->use = 0;
      if (buf->size < 0x7fffffff) {
        buf->compat_size = (uint)buf->size;
      }
      else {
        buf->compat_size = 0x7fffffff;
      }
      if (buf->use < 0x7fffffff) {
        buf->compat_use = (uint)buf->use;
      }
      else {
        buf->compat_use = 0x7fffffff;
      }
    }
    else {
      buf_local = (xmlBufPtr)0x0;
    }
  }
  else {
    buf_local = (xmlBufPtr)0x0;
  }
  return (xmlChar *)buf_local;
}

Assistant:

xmlChar *
xmlBufDetach(xmlBufPtr buf) {
    xmlChar *ret;

    if (buf == NULL)
        return(NULL);
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE)
        return(NULL);
    if (buf->buffer != NULL)
        return(NULL);
    if (buf->error)
        return(NULL);

    ret = buf->content;
    buf->content = NULL;
    buf->size = 0;
    buf->use = 0;
    UPDATE_COMPAT(buf);

    return ret;
}